

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::compiler::NodeTranslator::BrandScope> * __thiscall
kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=
          (Own<capnp::compiler::NodeTranslator::BrandScope> *this,
          Own<capnp::compiler::NodeTranslator::BrandScope> *other)

{
  BrandScope *object;
  BrandScope *this_00;
  BrandScope *pBVar1;
  Disposer *in_RDX;
  
  object = (BrandScope *)this->disposer;
  this_00 = this->ptr;
  pBVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pBVar1;
  other->ptr = (BrandScope *)0x0;
  if (this_00 != (BrandScope *)0x0) {
    Disposer::Dispose_<capnp::compiler::NodeTranslator::BrandScope,_true>::dispose
              ((Dispose_<capnp::compiler::NodeTranslator::BrandScope,_true> *)this_00,object,in_RDX)
    ;
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }